

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t uVar1;
  undefined8 in_RAX;
  SPIRVariable *pSVar2;
  SPIRExtension *pSVar3;
  bool bVar4;
  uint32_t i;
  ulong uVar5;
  _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  *this_00;
  undefined8 uStack_38;
  
  bVar4 = true;
  uStack_38 = in_RAX;
  switch(opcode) {
  case OpAtomicLoad:
  case OpAtomicExchange:
  case OpAtomicCompareExchange:
  case OpAtomicCompareExchangeWeak:
  case OpAtomicIIncrement:
  case OpAtomicIDecrement:
  case OpAtomicIAdd:
  case OpAtomicISub:
  case OpAtomicSMin:
  case OpAtomicUMin:
  case OpAtomicSMax:
  case OpAtomicUMax:
  case OpAtomicAnd:
  case OpAtomicOr:
  case OpAtomicXor:
switchD_002e6515_caseD_e3:
    if (2 < length) {
      args = args + 2;
LAB_002e6596:
      uVar1 = *args;
      if (uVar1 == 0) {
        return true;
      }
      pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,uVar1);
      if (pSVar2 == (SPIRVariable *)0x0) {
        return true;
      }
      if (StorageClassStorageBuffer < pSVar2->storage) {
        return true;
      }
      if ((0x160fU >> (pSVar2->storage & 0x1f) & 1) == 0) {
        return true;
      }
      this_00 = (_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                 *)this->variables;
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
LAB_002e65ca:
      ::std::__detail::
      _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert(this_00,(value_type *)((long)&uStack_38 + 4));
      return true;
    }
    break;
  case OpAtomicStore:
switchD_002e6515_caseD_e4:
    if (length != 0) goto LAB_002e6596;
    break;
  case OpAtomicXor|OpUndef:
  case OpAtomicAnd|OpSourceExtension:
    goto switchD_002e6515_caseD_f3;
  case OpPhi:
    if (1 < length) {
      for (uVar5 = 0; uVar5 < length - 2; uVar5 = uVar5 + 2) {
        pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[uVar5 + 2]);
        if (((pSVar2 != (SPIRVariable *)0x0) &&
            (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
           ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
          uStack_38 = CONCAT44(args[uVar5 + 2],(undefined4)uStack_38);
          ::std::__detail::
          _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)this->variables,(value_type *)((long)&uStack_38 + 4));
        }
      }
      return true;
    }
    break;
  default:
    switch(opcode) {
    case OpFunctionCall:
      if (2 < length) {
        for (uVar5 = 0; length - 3 != uVar5; uVar5 = uVar5 + 1) {
          pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[uVar5 + 3]);
          if (((pSVar2 != (SPIRVariable *)0x0) &&
              (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
             ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
            uStack_38 = CONCAT44(args[uVar5 + 3],(undefined4)uStack_38);
            ::std::__detail::
            _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            ::insert((_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                      *)this->variables,(value_type *)((long)&uStack_38 + 4));
          }
        }
        return true;
      }
      break;
    case OpFunctionEnd|OpSourceContinued:
    case OpVariable:
    case OpCopyMemorySized:
      goto switchD_002e6515_caseD_f3;
    case OpImageTexelPointer:
    case OpLoad:
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
    case OpArrayLength:
      goto switchD_002e6515_caseD_e3;
    case OpStore:
      goto switchD_002e6515_caseD_e4;
    case OpCopyMemory:
      if (1 < length) {
        pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,*args);
        if (((pSVar2 != (SPIRVariable *)0x0) &&
            (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
           ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
          uStack_38 = CONCAT44(*args,(undefined4)uStack_38);
          ::std::__detail::
          _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)this->variables,(value_type *)((long)&uStack_38 + 4));
        }
        pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[1]);
        if (pSVar2 == (SPIRVariable *)0x0) {
          return true;
        }
        if (StorageClassStorageBuffer < pSVar2->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar2->storage & 0x1f) & 1) == 0) {
          return true;
        }
        this_00 = (_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                   *)this->variables;
        uVar1 = args[1];
LAB_002e66d0:
        uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
        goto LAB_002e65ca;
      }
      break;
    default:
      if (opcode == OpExtInst) {
        if (4 < length) {
          pSVar3 = get<spirv_cross::SPIRExtension>(this->compiler,args[2]);
          if (*(int *)&(pSVar3->super_IVariant).field_0xc != 4) {
            return true;
          }
          if (args[3] != 1) {
            return true;
          }
          pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[4]);
          if (pSVar2 == (SPIRVariable *)0x0) {
            return true;
          }
          if (StorageClassStorageBuffer < pSVar2->storage) {
            return true;
          }
          if ((0x160fU >> (pSVar2->storage & 0x1f) & 1) == 0) {
            return true;
          }
          this_00 = (_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                     *)this->variables;
          uVar1 = args[4];
          goto LAB_002e66d0;
        }
      }
      else {
        if (opcode == OpCopyObject) goto switchD_002e6515_caseD_e3;
        if (opcode != OpSelect) {
          return true;
        }
        if (4 < length) {
          for (uVar5 = 0; length - 3 != uVar5; uVar5 = uVar5 + 1) {
            pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[uVar5 + 3]);
            if (((pSVar2 != (SPIRVariable *)0x0) &&
                (pSVar2->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
               ((0x160fU >> (pSVar2->storage & 0x1f) & 1) != 0)) {
              uStack_38 = CONCAT44(args[uVar5 + 3],(undefined4)uStack_38);
              ::std::__detail::
              _Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              ::insert((_Insert<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                        *)this->variables,(value_type *)((long)&uStack_38 + 4));
            }
          }
          return true;
        }
      }
    }
  }
  bVar4 = false;
switchD_002e6515_caseD_f3:
  return bVar4;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 5)
			return false;
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter)
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}